

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O3

string * __thiscall
Downloader::get_compiler_abi_cxx11_
          (string *__return_storage_ptr__,Downloader *this,bool allow_default)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppVar3;
  int iVar4;
  ostream *poVar5;
  int iVar6;
  pointer ppVar7;
  CCDir local_110;
  
  ppVar3 = args.options.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = args.options.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (args.options.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      args.options.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar4 = std::__cxx11::string::compare((char *)ppVar7);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)ppVar7), iVar4 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (ppVar7->second)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,
                   pcVar2 + (ppVar7->second)._M_string_length);
        return __return_storage_ptr__;
      }
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar3);
  }
  if (!allow_default) {
    poVar5 = operator<<((ostream *)&std::cout,(_xout_color)(uchar)ispring::xout._60_4_);
    poVar5 = std::operator<<(poVar5,"Specify compiler name using -c <compiler>.");
    poVar5 = operator<<(poVar5,ispring::xout[0x37]);
    std::endl<char,std::char_traits<char>>(poVar5);
LAB_00120f07:
    exit(1);
  }
  get_default_compiler();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar1 = &local_110.compiler_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.compiler_name._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_110.compiler_name.field_2._M_allocated_capacity._1_7_,
                  local_110.compiler_name.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
         local_110.compiler_name.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_110.compiler_name._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_110.compiler_name.field_2._M_allocated_capacity._1_7_,
                  local_110.compiler_name.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_110.compiler_name._M_string_length;
  local_110.compiler_name._M_string_length = 0;
  local_110.compiler_name.field_2._M_local_buf[0] = '\0';
  local_110.compiler_name._M_dataplus._M_p = (pointer)paVar1;
  CCDir::~CCDir(&local_110);
  iVar4 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if (iVar4 == 0) {
    poVar5 = operator<<((ostream *)&std::cout,(_xout_color)(uchar)ispring::xout._60_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"No compiler found.",0x12);
    poVar5 = operator<<(poVar5,ispring::xout[0x37]);
    std::endl<char,std::char_traits<char>>(poVar5);
    goto LAB_00120f07;
  }
  iVar4 = -0x37;
  if ((byte)(SUB41(ispring::xout._60_4_,2) - 0x30U) < 10) {
    iVar6 = -0x30;
LAB_00120dd3:
    printf("%s",(&PTR_anon_var_dwarf_2a93_00150a10)
                [iVar6 + ((uint)ispring::xout._60_4_ >> 0x10 & 0xff)]);
  }
  else {
    iVar6 = -0x37;
    if ((byte)(SUB41(ispring::xout._60_4_,2) + 0xbfU) < 6) goto LAB_00120dd3;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Compiler is not specified for installer. Use the default compiler.",0x42);
  if ((byte)(ispring::xout[0x3a] - 0x30) < 10) {
    iVar6 = -0x30;
LAB_00120e29:
    printf("%s",(&PTR_anon_var_dwarf_2a93_00150a10)[iVar6 + (uint)ispring::xout[0x3a]]);
  }
  else {
    iVar6 = -0x37;
    if ((byte)(ispring::xout[0x3a] + 0xbf) < 6) goto LAB_00120e29;
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(__return_storage_ptr__->_M_dataplus)._M_p,
                      __return_storage_ptr__->_M_string_length);
  if ((byte)(ispring::xout[0x37] - 0x30) < 10) {
    iVar4 = -0x30;
  }
  else if (5 < (byte)(ispring::xout[0x37] + 0xbf)) goto LAB_00120e93;
  printf("%s",(&PTR_anon_var_dwarf_2a93_00150a10)[iVar4 + (uint)ispring::xout[0x37]]);
LAB_00120e93:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return __return_storage_ptr__;
}

Assistant:

std::string get_compiler(bool allow_default=true){
        for(auto&e:args.options){
            if(e.first=="-c" || e.first=="--compiler"){
                return e.second;
            }
        }
        if(allow_default==false){
            std::cout << ispring::xout.light_red << "Specify compiler name using -c <compiler>." << ispring::xout.white << std::endl;
            exit(1);
        }
        std::string compiler_name=get_default_compiler().compiler_name;
        if(compiler_name==""){
            std::cout << ispring::xout.light_red << "No compiler found." << ispring::xout.white << std::endl;
            exit(1);
        }
        std::cout << ispring::xout.light_yellow << "Compiler is not specified for installer. Use the default compiler." << ispring::xout.light_green <<compiler_name << ispring::xout.white << std::endl;
        return compiler_name;
    }